

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O1

void __thiscall
osqp::anon_unknown_0::OsqpTest_DetectsPrimalInfeasible_Test::TestBody
          (OsqpTest_DetectsPrimalInfeasible_Test *this)

{
  OsqpExitCode OVar1;
  undefined8 *puVar2;
  double *pdVar3;
  variable_if_dynamic<long,__1> __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  pointer pcVar5;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> cert;
  OsqpSolver solver;
  OsqpInstance instance;
  OsqpSettings settings;
  SparseMatrix<double,_0,_int> constraint_matrix;
  SparseMatrix<double,_0,_int> objective_matrix;
  Triplet<double,_int> kTripletsQ [2];
  AssertHelper local_2a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  Message local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_280;
  StorageIndex *local_278;
  undefined1 local_268 [8];
  variable_if_dynamic<long,__1> local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 local_248 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_238;
  StorageIndex *local_230;
  undefined1 local_228 [24];
  StorageIndex *pSStack_210;
  StorageIndex *local_208;
  CompressedStorage<double,_long_long> CStack_200;
  undefined8 *local_1e0;
  StorageIndex *pSStack_1d8;
  SparseMatrix<double,_0,_long_long> local_1d0;
  Matrix<double,__1,_1,_0,__1,_1> local_188;
  Matrix<double,__1,_1,_0,__1,_1> local_178;
  OsqpSettings local_168;
  SparseMatrix<double,_0,_int> local_c8;
  SparseMatrix<double,_0,_int> local_80;
  StorageIndex local_38 [5];
  
  local_80.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_80.m_outerSize = 0;
  local_80.m_innerSize = 0;
  local_80.m_outerIndex = (StorageIndex *)0x0;
  local_80.m_innerNonZeros = (StorageIndex *)0x0;
  local_80.m_data.m_values = (Scalar *)0x0;
  local_80.m_data.m_indices = (StorageIndex_conflict *)0x0;
  local_80.m_data.m_size = 0;
  local_80.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_80,1,1);
  local_c8.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_c8.m_outerSize = 0;
  local_c8.m_innerSize = 0;
  local_c8.m_outerIndex = (StorageIndex *)0x0;
  local_c8.m_innerNonZeros = (StorageIndex *)0x0;
  local_c8.m_data.m_values = (Scalar *)0x0;
  local_c8.m_data.m_indices = (StorageIndex_conflict *)0x0;
  local_c8.m_data.m_size = 0;
  local_c8.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_c8,2,1);
  local_228._0_8_ = local_38;
  local_38[0] = 0;
  local_38[1] = 0x3ff0000000000000;
  local_38[2] = 1;
  local_38[3] = 0x3ff0000000000000;
  local_168.rho = (double)(local_38 + 4);
  Eigen::internal::
  set_from_triplets<Eigen::Triplet<double,int>const*,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
            (local_228,&local_168,&local_c8,local_268);
  local_228._0_8_ = local_228._0_8_ & 0xffffffffffffff00;
  local_228._8_8_ = (Scalar *)0xffffffffffffffff;
  local_228._16_8_ = (StorageIndex *)0x0;
  pSStack_210 = (StorageIndex *)0x0;
  local_208 = (StorageIndex *)0x0;
  CStack_200.m_values = (Scalar *)0x0;
  CStack_200.m_indices = (StorageIndex *)0x0;
  CStack_200.m_size = 0;
  CStack_200.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_long_long>::resize
            ((SparseMatrix<double,_0,_long_long> *)local_228,0,0);
  local_1e0 = (undefined8 *)0x0;
  pSStack_1d8 = (StorageIndex *)0x0;
  local_1d0.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_long_long>_>)false;
  local_1d0.m_outerSize = -1;
  local_1d0.m_innerSize = 0;
  local_1d0.m_outerIndex = (StorageIndex *)0x0;
  local_1d0.m_innerNonZeros = (StorageIndex *)0x0;
  local_1d0.m_data.m_values = (Scalar *)0x0;
  local_1d0.m_data.m_indices = (StorageIndex *)0x0;
  local_1d0.m_data.m_size = 0;
  local_1d0.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_long_long>::resize(&local_1d0,0,0);
  local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)local_228,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&local_80);
  puVar2 = local_1e0;
  if (pSStack_1d8 != (StorageIndex *)0x1) {
    free(local_1e0);
    puVar2 = (undefined8 *)malloc(8);
    if (puVar2 == (undefined8 *)0x0) goto LAB_0011dae2;
  }
  local_1e0 = puVar2;
  pSStack_1d8 = (StorageIndex *)0x1;
  *local_1e0 = 0;
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)&local_1d0,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&local_c8);
  pdVar3 = local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  if (local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 2
     ) {
    free(local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pdVar3 = (double *)malloc(0x10);
    if (((ulong)pdVar3 & 0xf) != 0) goto LAB_0011db2f;
    if (pdVar3 == (double *)0x0) goto LAB_0011dae2;
  }
  local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar3
  ;
  local_168.rho = (double)&local_188;
  local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
  local_168.sigma = 0.0;
  local_168.scaling = 1;
  local_168._24_8_ = 1;
  *local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 2.0;
  local_268 = (undefined1  [8])&DAT_4008000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_168,
             (Scalar *)local_268);
  if ((local_168._24_8_ + (long)local_168.sigma !=
       (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_168.rho)->m_storage).
       m_rows) || (local_168.scaling != 1)) {
LAB_0011dac3:
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pdVar3 = local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  if (local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 2
     ) {
    free(local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    pdVar3 = (double *)malloc(0x10);
    if (((ulong)pdVar3 & 0xf) != 0) {
LAB_0011db2f:
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar3 == (double *)0x0) {
LAB_0011dae2:
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = execv;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar3
  ;
  local_168.rho = (double)&local_178;
  local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
  local_168.sigma = 0.0;
  local_168.scaling = 1;
  local_168._24_8_ = 1;
  *local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 2.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_168,
             (Scalar *)&(anonymous_namespace)::kInfinity);
  if ((local_168._24_8_ + (long)local_168.sigma !=
       (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_168.rho)->m_storage).
       m_rows) || (local_168.scaling != 1)) goto LAB_0011dac3;
  local_248._0_8_ =
       (__uniq_ptr_data<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter,_true,_true>)0x0;
  OsqpSettings::OsqpSettings(&local_168);
  OsqpSolver::Init((OsqpSolver *)local_268,(OsqpInstance *)local_248,(OsqpSettings *)local_228);
  local_288.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       ((tuple<osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>)local_268 ==
       (_Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>)0x1);
  pbStack_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_268 & 1) == 0) {
    absl::status_internal::StatusRep::Unref((StatusRep *)local_268);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pbStack_280;
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)&local_288,
               (AssertionResult *)"solver.Init(instance, settings).ok()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0xdd,(char *)local_268);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
    }
    if (local_298._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
    __ptr_00.m_value = (long)pbStack_280;
    if (pbStack_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0011da0e;
  }
  else {
    if (pbStack_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,pbStack_280);
    }
    OVar1 = OsqpSolver::Solve((OsqpSolver *)local_248);
    local_288.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = OVar1;
    local_298._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)local_268,"solver.Solve()","OsqpExitCode::kPrimalInfeasible",
               (OsqpExitCode *)&local_288,(OsqpExitCode *)&local_298);
    if (local_268[0] == (internal)0x0) {
      testing::Message::Message(&local_288);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260.m_value ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_260.m_value;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_298,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                 ,0xde,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,&local_288);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
      if (local_288.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_288.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260.m_value ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0011da0e;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_260;
      __ptr_00.m_value = local_260.m_value;
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260.m_value !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_260,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_260.m_value);
      }
      OsqpSolver::primal_infeasibility_certificate
                ((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 local_268,(OsqpSolver *)local_248);
      testing::internal::FloatingEqMatcher<double>::FloatingEqMatcher
                ((FloatingEqMatcher<double> *)(local_248 + 8),-1.0,false,1e-05);
      local_278 = local_230;
      local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )local_248._8_8_;
      pbStack_280 = pbStack_238;
      if ((local_260.m_value < 1) ||
         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260.m_value ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1)) {
LAB_0011db10:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xa3,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Map<const Eigen::Matrix<double, -1, 1>>, 0>::operator[](Index) const [Derived = Eigen::Map<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                     );
      }
      local_2a0.data_ =
           (AssertHelperData *)(*(double *)local_268 / *(double *)((long)local_268 + 8));
      testing::internal::PredicateFormatterFromMatcher<testing::internal::FloatingEqMatcher<double>>
      ::operator()(&local_298,(char *)&local_288,(double *)"cert[0] / cert[1]");
      if ((char)local_298._M_head_impl == '\0') {
        testing::Message::Message(&local_288);
        if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_290->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0xe3,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2a0,&local_288);
        testing::internal::AssertHelper::~AssertHelper(&local_2a0);
        if (local_288.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_288.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
      }
      if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_290,local_290);
      }
      if (local_260.m_value < 2) goto LAB_0011db10;
      local_298._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268)->_M_local_buf + 8);
      local_2a0.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperLE<double,double>
                ((internal *)&local_288,"cert[1]","0.0",(double *)&local_298,(double *)&local_2a0);
      if (local_288.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_298);
        if (pbStack_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar5 = "";
        }
        else {
          pcVar5 = (pbStack_280->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0xe4,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_298);
        testing::internal::AssertHelper::~AssertHelper(&local_2a0);
        if (local_298._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_298._M_head_impl + 8))();
        }
      }
      if (pbStack_280 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_280,pbStack_280);
      }
      if ((local_260.m_value < 1) ||
         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260.m_value ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1))
      goto LAB_0011db10;
      local_298._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (*(double *)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_268 +
            *(double *)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_268 +
           *(double *)
            (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268)->_M_local_buf + 8) * 3.0);
      local_2a0.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperLT<double,double>
                ((internal *)&local_288,"cert[0] * 2 + cert[1] * 3","0.0",(double *)&local_298,
                 (double *)&local_2a0);
      if (local_288.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_298);
        if (pbStack_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar5 = "";
        }
        else {
          pcVar5 = (pbStack_280->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0xe5,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_298);
        testing::internal::AssertHelper::~AssertHelper(&local_2a0);
        if (local_298._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_298._M_head_impl + 8))();
        }
      }
      if (pbStack_280 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0011da0e;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&pbStack_280;
      __ptr_00.m_value = (long)pbStack_280;
    }
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00.m_value);
LAB_0011da0e:
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            ((unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *)local_248);
  free(local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_188.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_1d0.m_outerIndex);
  free(local_1d0.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&local_1d0.m_data);
  free(local_1e0);
  free(pSStack_210);
  free(local_208);
  Eigen::internal::CompressedStorage<double,_long_long>::~CompressedStorage(&CStack_200);
  free(local_c8.m_outerIndex);
  free(local_c8.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_c8.m_data);
  free(local_80.m_outerIndex);
  free(local_80.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_80.m_data);
  return;
}

Assistant:

TEST(OsqpTest, DetectsPrimalInfeasible) {
  // Minimize 0 subject to:
  // x == 2, x >= 3.
  SparseMatrix<double> objective_matrix(1, 1);

  SparseMatrix<double> constraint_matrix(2, 1);
  const Triplet<double> kTripletsQ[] = {{0, 0, 1.0}, {1, 0, 1.0}};
  constraint_matrix.setFromTriplets(std::begin(kTripletsQ),
                                    std::end(kTripletsQ));

  OsqpInstance instance;
  instance.objective_matrix = objective_matrix;
  instance.objective_vector.resize(1);
  instance.objective_vector << 0.0;
  instance.constraint_matrix = constraint_matrix;
  instance.lower_bounds.resize(2);
  instance.lower_bounds << 2, 3;
  instance.upper_bounds.resize(2);
  instance.upper_bounds << 2, kInfinity;

  OsqpSolver solver;
  OsqpSettings settings;
  ASSERT_TRUE(solver.Init(instance, settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kPrimalInfeasible);
  Eigen::Map<const VectorXd> cert = solver.primal_infeasibility_certificate();
  // The infeasibility certificate satisfies cert[0] + cert[1] == 0,
  // cert[0]* 2 + cert[1] * 3 < 0, and cert[1] <= 0. See the OSQP documentation
  // for the general definition of the certificate.
  EXPECT_THAT(cert[0] / cert[1], DoubleNear(-1.0, kTolerance));
  EXPECT_LE(cert[1], 0.0);
  EXPECT_LT(cert[0] * 2 + cert[1] * 3, 0.0);
}